

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cc
# Opt level: O0

symNodePtr __thiscall dh::symTab::research_elem_global(symTab *this,string *c)

{
  bool bVar1;
  element_type *c_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  symNodePtr sVar2;
  symNodePtr tmp_ptr;
  string *c_local;
  symTab *this_local;
  
  research_elem((symTab *)&stack0xffffffffffffffd0,c);
  bVar1 = std::operator==((shared_ptr<dh::symTabElem> *)&stack0xffffffffffffffd0,(nullptr_t)0x0);
  if (bVar1) {
    bVar1 = std::operator==((shared_ptr<dh::symTab> *)(c + 8),(nullptr_t)0x0);
    if (bVar1) {
      std::shared_ptr<dh::symTabElem>::shared_ptr((shared_ptr<dh::symTabElem> *)this,(nullptr_t)0x0)
      ;
    }
    else {
      c_00 = std::__shared_ptr_access<dh::symTab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::symTab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )(c + 8));
      research_elem_global(this,(string *)c_00);
    }
  }
  else {
    std::shared_ptr<dh::symTabElem>::shared_ptr
              ((shared_ptr<dh::symTabElem> *)this,
               (shared_ptr<dh::symTabElem> *)&stack0xffffffffffffffd0);
  }
  std::shared_ptr<dh::symTabElem>::~shared_ptr
            ((shared_ptr<dh::symTabElem> *)&stack0xffffffffffffffd0);
  sVar2.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (symNodePtr)sVar2.super___shared_ptr<dh::symTabElem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

symNodePtr symTab::research_elem_global( const ::std::string& c)
{
	auto tmp_ptr = research_elem(c);
	if ( tmp_ptr == nullptr)
	{
		if ( this->upper_tab == nullptr)
		{
			return nullptr;
		}
		return this->upper_tab->research_elem_global(c);
	} else 
	{
		return tmp_ptr;
	}
}